

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

timestamp_t
duckdb::TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,timestamp_t origin)

{
  bool bVar1;
  timestamp_t tVar2;
  int64_t in_RCX;
  timestamp_t in_RDX;
  int64_t origin_micros;
  int64_t ts_micros;
  int64_t bucket_width_micros;
  int64_t in_stack_ffffffffffffff88;
  timestamp_t in_stack_ffffffffffffffc8;
  interval_t local_18;
  int64_t local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RDX);
  if (bVar1) {
    duckdb::Interval::GetMicro(&local_18);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_stack_ffffffffffffffc8);
    duckdb::Timestamp::GetEpochMicroSeconds(tVar2);
    tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_stack_ffffffffffffffc8);
    duckdb::Timestamp::GetEpochMicroSeconds(tVar2);
    WidthConvertibleToMicrosCommon(tVar2.value,in_RCX,in_stack_ffffffffffffff88);
    local_8 = (int64_t)Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                                 (in_stack_ffffffffffffffc8);
  }
  else {
    local_8 = (int64_t)Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_RDX);
  }
  return (timestamp_t)local_8;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			int64_t origin_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(origin));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, origin_micros));
		}